

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint32 uVar1;
  Rep *pRVar2;
  Rep *pRVar3;
  void *pvVar4;
  LogMessage *pLVar5;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar6;
  ShapeRange *pSVar7;
  LayerUnion LVar8;
  size_t sVar9;
  size_t sVar10;
  BorderAmounts *pBVar11;
  long lVar12;
  runtime_error *this_02;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ShapeRange local_c8;
  LogMessage local_a8;
  ShapeRange local_70;
  ShapeRange local_50;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    pLVar5 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar5);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a8);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  pSVar7 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_a8,pSVar6,pSVar7);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_a8);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  pSVar7 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_a8,pSVar6,pSVar7);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_a8);
  pSVar6 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar6);
  pSVar6 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar6);
  pSVar6 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar6);
  if (specLayer->_oneof_case_[0] == 0x78) {
    LVar8 = specLayer->layer_;
  }
  else {
    LVar8.pooling_ = Specification::PoolingLayerParams::default_instance();
  }
  iVar13 = 3;
  iVar16 = 3;
  if (((LVar8.convolution_)->kernelsize_).current_size_ == 2) {
    iVar16 = *(int *)&((LVar8.innerproduct_)->bias_->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    iVar13 = ((LVar8.innerproduct_)->bias_->floatvalue_).current_size_;
  }
  iVar18 = 1;
  iVar17 = 1;
  if (((LVar8.convolution_)->stride_).current_size_ == 2) {
    iVar17 = *(int *)&((LVar8.cropresize_)->boxindicesmode_->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    iVar18 = (LVar8.cropresize_)->boxindicesmode_->boxmode_;
  }
  if ((LVar8.pooling_)->globalpooling_ == true) {
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
  }
  else {
    uVar1 = (LVar8.scale_)->_cached_size_;
    if ((int)uVar1 < 0x1f) {
      if (uVar1 != 0x1e) {
        if (uVar1 != 0) {
          return;
        }
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Pooling padding type not set");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pBVar11 = ((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->valid_->paddingamounts_;
      if (pBVar11 == (BorderAmounts *)0x0) {
        pBVar11 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
      }
      iVar20 = 0;
      iVar14 = 0;
      iVar19 = 0;
      if ((pBVar11->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 2) {
        pRVar3 = (pBVar11->borderamounts_).super_RepeatedPtrFieldBase.rep_;
        pvVar4 = pRVar3->elements[0];
        lVar12 = *(long *)(pRVar3 + 1);
        iVar20 = *(int *)(lVar12 + 0x10);
        iVar14 = *(int *)(lVar12 + 0x18);
        iVar19 = *(int *)((long)pvVar4 + 0x18) + *(int *)((long)pvVar4 + 0x10);
      }
      if (0 < iVar16 - iVar19) {
        pSVar6 = ShapeConstraint::heightRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar6);
        if (sVar9 == 0) {
          lVar12 = 0;
        }
        else {
          pSVar6 = ShapeConstraint::heightRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar6);
          lVar12 = sVar9 - 1;
        }
        ShapeConstraint::lowerBoundHeight(this_00,(ulong)(uint)(iVar16 - iVar19) + lVar12 * iVar17);
      }
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator+(&local_70,pSVar6,iVar19 - iVar16);
      ShapeRange::operator/(&local_c8,&local_70,(long)iVar17);
      ShapeRange::operator+((ShapeRange *)&local_a8,&local_c8,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_a8);
      uVar15 = iVar13 - (iVar14 + iVar20);
      if (0 < (int)uVar15) {
        pSVar6 = ShapeConstraint::widthRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar6);
        if (sVar9 == 0) {
          lVar12 = 0;
        }
        else {
          pSVar6 = ShapeConstraint::widthRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar6);
          lVar12 = sVar9 - 1;
        }
        ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar15 + lVar12 * iVar18);
      }
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator+(&local_70,pSVar6,(iVar14 + iVar20) - iVar13);
      ShapeRange::operator/(&local_c8,&local_70,(long)iVar18);
    }
    else {
      if (uVar1 != 0x1f) {
        if (uVar1 != 0x20) {
          return;
        }
        iVar19 = 0;
        iVar14 = 0;
        iVar20 = 0;
        if ((((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->includelastpixel_->paddingamounts_
            ).current_size_ == 2) {
          pRVar2 = (((PoolingPaddingTypeUnion *)&(LVar8.scale_)->bias_)->includelastpixel_->
                   paddingamounts_).rep_;
          iVar20 = (int)pRVar2->elements[0];
          iVar14 = *(int *)&pRVar2[1].arena;
        }
        if (iVar20 != 0 || iVar14 != 0) {
          sVar9 = ShapeConstraint::minimumHeight(this_00);
          sVar10 = ShapeConstraint::minimumHeight(this_00);
          iVar19 = -(uint)((int)sVar10 + iVar20 <=
                          (int)sVar9 + ((iVar20 + iVar17) * 2 - iVar16) + -2);
        }
        pSVar6 = ShapeConstraint::heightRange(this_00);
        ShapeRange::operator+(&local_50,pSVar6,-(iVar16 + iVar20 * -2));
        ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar17);
        ShapeRange::operator+(&local_c8,&local_70,1);
        ShapeRange::operator+((ShapeRange *)&local_a8,&local_c8,iVar19);
        ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_a8);
        uVar15 = iVar16 + iVar20 * -2;
        if (uVar15 != 0 && iVar20 * 2 <= iVar16) {
          pSVar6 = ShapeConstraint::heightRange(this_01);
          sVar9 = ShapeRange::minimumValue(pSVar6);
          ShapeConstraint::lowerBoundHeight(this_00,(uVar15 + sVar9) - 1);
        }
        if (iVar20 == 0 && iVar14 == 0) {
          iVar16 = 0;
        }
        else {
          sVar9 = ShapeConstraint::minimumWidth(this_00);
          sVar10 = ShapeConstraint::minimumWidth(this_00);
          iVar16 = -(uint)((int)sVar10 + iVar14 <=
                          (int)sVar9 + ((iVar18 + iVar14) * 2 - iVar13) + -2);
        }
        pSVar6 = ShapeConstraint::widthRange(this_00);
        ShapeRange::operator+(&local_50,pSVar6,-(iVar13 + iVar14 * -2));
        ShapeRange::divideAndRoundUp(&local_70,&local_50,(long)iVar18);
        ShapeRange::operator+(&local_c8,&local_70,1);
        ShapeRange::operator+((ShapeRange *)&local_a8,&local_c8,iVar16);
        ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)&local_a8);
        uVar15 = iVar13 + iVar14 * -2;
        if (uVar15 == 0 || SBORROW4(iVar13,iVar14 * 2) != (int)uVar15 < 0) {
          return;
        }
        pSVar6 = ShapeConstraint::widthRange(this_01);
        sVar9 = ShapeRange::minimumValue(pSVar6);
        ShapeConstraint::lowerBoundHeight(this_00,(uVar15 + sVar9) - 1);
        return;
      }
      pSVar6 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      ShapeRange::operator/(&local_c8,&local_70,(long)iVar17);
      ShapeRange::operator+((ShapeRange *)&local_a8,&local_c8,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_a8);
      pSVar6 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator-(&local_70,pSVar6,1);
      ShapeRange::operator/(&local_c8,&local_70,(long)iVar18);
    }
    ShapeRange::operator+((ShapeRange *)&local_a8,&local_c8,1);
    ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)&local_a8);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() == 2){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() == 2){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() == 2){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() == 2){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}